

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint32_t helper_fmovemx_st_postinc_m68k(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask)

{
  long lVar1;
  uintptr_t unaff_retaddr;
  
  lVar1 = 0x78;
  do {
    if ((char)mask < '\0') {
      cpu_stl_data_ra_m68k(env,addr,*(int *)((long)env->dregs + lVar1) << 0x10,unaff_retaddr);
      cpu_stq_data_ra_m68k(env,addr + 4,*(uint64_t *)((long)env->dregs + lVar1 + -8),unaff_retaddr);
      addr = addr + 0xc;
    }
    mask = mask * 2;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xf8);
  return addr;
}

Assistant:

uint32_t HELPER(fmovemx_st_postinc)(CPUM68KState *env, uint32_t addr,
                                    uint32_t mask)
{
    return fmovem_postinc(env, addr, mask, cpu_st_floatx80_ra);
}